

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_sbar.cpp
# Opt level: O2

void __thiscall
DBaseStatusBar::GetCurrentAmmo
          (DBaseStatusBar *this,AAmmo **ammo1,AAmmo **ammo2,int *ammocount1,int *ammocount2)

{
  AWeapon *pAVar1;
  AAmmo *pAVar2;
  int iVar3;
  AAmmo *pAVar4;
  
  pAVar1 = this->CPlayer->ReadyWeapon;
  if (pAVar1 == (AWeapon *)0x0) {
    *ammo2 = (AAmmo *)0x0;
    *ammo1 = (AAmmo *)0x0;
    pAVar2 = *ammo2;
    iVar3 = 0;
  }
  else {
    pAVar2 = GC::ReadBarrier<AAmmo>((AAmmo **)&pAVar1->Ammo1);
    *ammo1 = pAVar2;
    pAVar2 = GC::ReadBarrier<AAmmo>((AAmmo **)&this->CPlayer->ReadyWeapon->Ammo2);
    *ammo2 = pAVar2;
    pAVar4 = *ammo1;
    if (pAVar4 == (AAmmo *)0x0) {
      *ammo1 = pAVar2;
      *ammo2 = (AAmmo *)0x0;
      pAVar4 = *ammo1;
      pAVar2 = (AAmmo *)0x0;
      iVar3 = 0;
      if (pAVar4 == (AAmmo *)0x0) {
        *ammocount1 = 0;
        goto LAB_0057d4d4;
      }
    }
    iVar3 = (pAVar4->super_AInventory).Amount;
  }
  *ammocount1 = iVar3;
  if (pAVar2 == (AAmmo *)0x0) {
    iVar3 = 0;
  }
  else {
    iVar3 = (pAVar2->super_AInventory).Amount;
  }
LAB_0057d4d4:
  *ammocount2 = iVar3;
  return;
}

Assistant:

void DBaseStatusBar::GetCurrentAmmo (AAmmo *&ammo1, AAmmo *&ammo2, int &ammocount1, int &ammocount2) const
{
	if (CPlayer->ReadyWeapon != NULL)
	{
		ammo1 = CPlayer->ReadyWeapon->Ammo1;
		ammo2 = CPlayer->ReadyWeapon->Ammo2;
		if (ammo1 == NULL)
		{
			ammo1 = ammo2;
			ammo2 = NULL;
		}
	}
	else
	{
		ammo1 = ammo2 = NULL;
	}
	ammocount1 = ammo1 != NULL ? ammo1->Amount : 0;
	ammocount2 = ammo2 != NULL ? ammo2->Amount : 0;
}